

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticpyramid.cpp
# Opt level: O2

void pzgeom::TPZQuadraticPyramid::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  Fad<double> *pFVar1;
  undefined1 local_260 [16];
  FadCst<int> FStack_250;
  FadCst<int> *local_248;
  FadCst<int> local_240;
  FadCst<int> local_238;
  FadCst<int> local_230;
  FadCst<int> local_228;
  undefined1 *local_220;
  FadCst<int> local_218;
  undefined1 local_210 [16];
  undefined1 local_200 [24];
  undefined1 local_1e8 [8];
  FadCst<int> local_1e0;
  FadCst<int> FStack_1d8;
  undefined1 *local_1d0;
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [24];
  undefined1 local_198 [8];
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
  *local_190;
  FadCst<int> local_188;
  undefined1 local_180 [16];
  FadCst<int> local_170;
  FadCst<int> local_168;
  Fad<double> eta;
  undefined1 local_140 [16];
  Fad<double> qsi;
  FadCst<int> local_110;
  Fad<double> *local_108;
  FadCst<int> *local_100;
  FadCst<int> *local_f8;
  undefined1 *local_f0;
  FadCst<int> *local_e8;
  FadCst<int> local_e0;
  FadCst<int> local_d8;
  FadCst<int> local_d0;
  FadCst<int> *local_c8;
  FadCst<int> *local_c0;
  undefined1 **local_b8;
  Fad<double> *local_b0;
  FadCst<int> **local_a8;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  local_a0;
  FadCst<int> local_90;
  FadCst<int> local_88;
  undefined1 *local_80;
  FadCst<int> local_78;
  Fad<double> check;
  Fad<double> zeta;
  
  Fad<double>::Fad(&qsi,par->fStore);
  Fad<double>::Fad(&eta,par->fStore + 1);
  Fad<double>::Fad(&zeta,par->fStore + 2);
  local_260._8_4_ = 0;
  local_260._12_4_ = 0x3ff00000;
  FStack_250 = (FadCst<int>)0x0;
  local_260._0_8_ = &zeta;
  Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadCst<double>>>
            (&check,(FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)local_260);
  if (1e-06 <= ABS(check.val_)) {
    local_210._0_8_ = local_1e8;
    local_1e0.constant_ = 1;
    local_1e0.defaultVal = 0;
    local_218 = (FadCst<int>)&eta;
    local_220 = (undefined1 *)0xffffffff;
    local_1c8._8_8_ = local_180;
    local_1b0._0_8_ = local_1c8;
    local_170 = (FadCst<int>)&local_240;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_1b0._8_8_ = &local_170;
    local_198 = (undefined1  [8])local_1b0;
    local_248 = (FadCst<int> *)local_200;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_260;
    local_230 = (FadCst<int>)&qsi;
    local_210._8_8_ = &qsi;
    local_200._16_8_ = &zeta;
    FStack_1d8 = local_218;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_180._0_8_ = &local_228;
    local_180._8_8_ = &zeta;
    local_168 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,0,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_198);
    local_1e0.constant_ = 1;
    local_1e0.defaultVal = 0;
    local_230 = (FadCst<int>)&eta;
    local_210._0_8_ = local_1e8;
    local_218 = (FadCst<int>)&qsi;
    local_220 = (undefined1 *)0x1;
    local_1c8._8_8_ = local_180;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_170 = (FadCst<int>)&local_240;
    local_1b0._0_8_ = local_1c8;
    local_1b0._8_8_ = &local_170;
    local_198 = (undefined1  [8])local_140;
    local_140._0_8_ = local_1b0;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (FadCst<int> *)local_200;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_260;
    local_210._8_8_ = local_218;
    local_200._16_8_ = &zeta;
    FStack_1d8 = local_230;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_180._0_8_ = &local_228;
    local_180._8_8_ = &zeta;
    local_168 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,1,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_198);
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_218 = (FadCst<int>)&eta;
    local_210._0_8_ = local_1e8;
    local_230 = (FadCst<int>)&qsi;
    local_220 = (undefined1 *)0x1;
    local_1c8._8_8_ = local_180;
    local_238.constant_ = 1;
    local_238.defaultVal = 0;
    local_170 = (FadCst<int>)&local_240;
    local_1b0._0_8_ = local_1c8;
    local_1b0._8_8_ = &local_170;
    local_140._0_8_ = local_1b0;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (FadCst<int> *)local_200;
    local_198 = (undefined1  [8])local_140;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_260;
    local_210._8_8_ = local_230;
    local_200._16_8_ = &zeta;
    FStack_1d8 = local_218;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_180._0_8_ = &local_228;
    local_180._8_8_ = &zeta;
    local_168 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,2,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_198);
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_218 = (FadCst<int>)&eta;
    local_210._0_8_ = local_1e8;
    local_230 = (FadCst<int>)&qsi;
    local_220 = (undefined1 *)0x1;
    local_1c8._8_8_ = local_180;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_170 = (FadCst<int>)&local_240;
    local_1b0._0_8_ = local_1c8;
    local_1b0._8_8_ = &local_170;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (FadCst<int> *)local_200;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_260;
    local_210._8_8_ = local_230;
    local_200._16_8_ = &zeta;
    FStack_1d8 = local_218;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_180._0_8_ = &local_228;
    local_180._8_8_ = &zeta;
    local_168 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,3,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_198);
    local_1e0.constant_ = 2;
    local_1e0.defaultVal = 0;
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)local_1e8;
    local_220 = local_260;
    local_228 = (FadCst<int>)&zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,4,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)&local_228);
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    FStack_1d8 = (FadCst<int>)&eta;
    local_210._0_8_ = local_1e8;
    local_220 = (undefined1 *)0xffffffff;
    local_230 = (FadCst<int>)&qsi;
    local_1c8._8_8_ = local_180;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_170 = (FadCst<int>)&local_240;
    local_1b0._0_8_ = local_1c8;
    local_1b0._8_8_ = &local_170;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40000000;
    FStack_250 = (FadCst<int>)0x0;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_260;
    local_248 = (FadCst<int> *)local_200;
    local_218 = local_230;
    local_210._8_8_ = &zeta;
    local_200._16_8_ = &zeta;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_180._0_8_ = &local_228;
    local_180._8_8_ = &zeta;
    local_168 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,5,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_198);
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_218 = (FadCst<int>)&eta;
    local_210._0_8_ = local_1e8;
    local_220 = (undefined1 *)0xffffffff;
    local_180._0_8_ = &local_228;
    local_1c8._8_8_ = local_180;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_230 = (FadCst<int>)&qsi;
    local_170 = (FadCst<int>)&local_240;
    local_1b0._0_8_ = local_1c8;
    local_1b0._8_8_ = &local_170;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40000000;
    FStack_250 = (FadCst<int>)0x0;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_260;
    local_248 = (FadCst<int> *)local_200;
    local_210._8_8_ = &zeta;
    local_200._16_8_ = &zeta;
    FStack_1d8 = local_218;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_180._8_8_ = &zeta;
    local_168 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,6,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_198);
    local_210._0_8_ = &qsi;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = (undefined1 *)0xffffffff;
    local_180._0_8_ = local_1e8;
    local_180._8_8_ = &local_228;
    local_1c8._8_8_ = local_180;
    local_238.constant_ = 1;
    local_238.defaultVal = 0;
    local_230 = (FadCst<int>)&eta;
    local_170 = (FadCst<int>)&local_240;
    local_1b0._0_8_ = local_1c8;
    local_1b0._8_8_ = &local_170;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40000000;
    FStack_250 = (FadCst<int>)0x0;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_260;
    local_248 = (FadCst<int> *)local_200;
    local_218 = (FadCst<int>)&zeta;
    local_210._8_8_ = local_210._0_8_;
    local_200._16_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_168 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,7,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_198);
    local_210._0_8_ = &eta;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = (undefined1 *)0xffffffff;
    local_180._0_8_ = local_1e8;
    local_180._8_8_ = &local_228;
    local_1c8._0_8_ = local_140;
    local_1c8._8_8_ = local_180;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_170 = (FadCst<int>)&local_240;
    local_1b0._0_8_ = local_1c8;
    local_1b0._8_8_ = &local_170;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40000000;
    FStack_250 = (FadCst<int>)0x0;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_260;
    local_248 = (FadCst<int> *)local_200;
    local_230 = (FadCst<int>)&qsi;
    local_218 = (FadCst<int>)&zeta;
    local_210._8_8_ = local_210._0_8_;
    local_200._16_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_168 = (FadCst<int>)&zeta;
    local_140._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,8,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_198);
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&eta;
    local_1b0._0_8_ = local_260;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1b0;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_1c8._0_8_ = local_1e8;
    local_200._8_8_ = local_1c8;
    local_220 = (undefined1 *)0xffffffff;
    local_238 = (FadCst<int>)&local_228;
    local_210._0_8_ = &local_240;
    local_240 = (FadCst<int>)local_200;
    local_218 = (FadCst<int>)&zeta;
    local_200._0_8_ = (Fad<double> *)local_198;
    FStack_1d8 = (FadCst<int>)&qsi;
    local_1c8._8_8_ = &zeta;
    local_1b0._8_8_ = &zeta;
    local_198 = (undefined1  [8])&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,9,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_210);
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&eta;
    local_1b0._0_8_ = local_260;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1b0;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_1c8._0_8_ = local_1e8;
    local_200._0_8_ = local_198;
    local_200._8_8_ = local_1c8;
    local_220 = (undefined1 *)0xffffffff;
    local_238 = (FadCst<int>)&local_228;
    local_210._0_8_ = &local_240;
    local_240 = (FadCst<int>)local_200;
    local_218 = (FadCst<int>)&zeta;
    FStack_1d8 = (FadCst<int>)&qsi;
    local_1c8._8_8_ = &zeta;
    local_1b0._8_8_ = &zeta;
    local_198 = (undefined1  [8])&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,10,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_210);
    local_260._8_4_ = 1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&eta;
    local_1b0._0_8_ = local_260;
    local_1e0.constant_ = 1;
    local_1e0.defaultVal = 0;
    local_1c8._0_8_ = local_1e8;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_200._0_8_ = local_198;
    local_220 = (undefined1 *)0x1;
    local_238 = (FadCst<int>)&local_228;
    local_240 = (FadCst<int>)local_200;
    local_218 = (FadCst<int>)&zeta;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&qsi;
    local_1c8._8_8_ = &zeta;
    local_1b0._8_8_ = &zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,0xb,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>_>_>
                       *)&local_240);
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&eta;
    local_1b0._0_8_ = local_260;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1b0;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_1c8._0_8_ = local_1e8;
    local_200._0_8_ = local_198;
    local_200._8_8_ = local_1c8;
    local_220 = (undefined1 *)0xffffffff;
    local_240 = (FadCst<int>)local_200;
    local_238 = (FadCst<int>)&local_228;
    local_218 = (FadCst<int>)&zeta;
    local_210._0_8_ =
         (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)&local_240;
    FStack_1d8 = (FadCst<int>)&qsi;
    local_1c8._8_8_ = &zeta;
    local_1b0._8_8_ = &zeta;
    local_198 = (undefined1  [8])&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,0xc,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_210);
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_210._0_8_ = &eta;
    local_1b0._0_8_ = local_1e8;
    local_220 = (undefined1 *)0x2;
    local_210._8_8_ = &local_228;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = &local_240;
    local_200._8_8_ = local_260;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&qsi;
    local_200._0_8_ = (Fad<double> *)local_198;
    FStack_1d8 = (FadCst<int>)local_210._0_8_;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_1c8._8_8_ = &zeta;
    local_1b0._8_8_ = &zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_200);
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_1b0._0_8_ = local_1e8;
    local_220 = (undefined1 *)0x2;
    local_218 = (FadCst<int>)&eta;
    local_210._0_8_ = &local_228;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = &local_240;
    local_200._8_8_ = local_260;
    local_230 = (FadCst<int>)&zeta;
    local_210._8_8_ = &qsi;
    local_200._0_8_ = (Fad<double> *)local_198;
    FStack_1d8 = (FadCst<int>)&qsi;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_1c8._8_8_ = &zeta;
    local_1b0._8_8_ = &zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_200);
    local_140._0_8_ = &local_a0;
    local_b0 = &eta;
    local_c8 = &local_e0;
    local_c0 = &local_d0;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = (undefined1 *)0xffffffff;
    local_b8 = &local_f0;
    local_f0 = local_1e8;
    local_e8 = &local_228;
    local_a8 = &local_c0;
    local_168 = (FadCst<int>)&local_b0;
    local_170 = (FadCst<int>)local_140;
    local_238.constant_ = 1;
    local_238.defaultVal = 0;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)0xffffffff;
    local_f8 = &local_110;
    local_180._8_8_ = &local_100;
    local_100 = &local_240;
    local_180._0_8_ = &local_170;
    local_210._0_8_ = &local_90;
    local_90 = (FadCst<int>)local_180;
    local_1b0._8_4_ = -1;
    local_1b0._12_4_ = 0;
    local_1c8._8_4_ = -1;
    local_1c8._12_4_ = 0;
    local_88 = (FadCst<int>)local_1b0;
    local_80 = local_1c8;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_210._8_8_ = local_260;
    local_248 = &local_88;
    local_230 = (FadCst<int>)&qsi;
    local_218 = (FadCst<int>)&zeta;
    local_200._16_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_1c8._16_8_ = &zeta;
    local_1b0._16_8_ = &zeta;
    local_188 = (FadCst<int>)&zeta;
    local_140._8_8_ = &qsi;
    local_110 = (FadCst<int>)local_200;
    local_108 = (Fad<double> *)local_198;
    local_e0 = (FadCst<int>)&qsi;
    local_d8 = (FadCst<int>)&qsi;
    local_d0 = (FadCst<int>)&qsi;
    local_a0.fadexpr_.left_ =
         (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *)
         local_b0;
    local_a0.fadexpr_.right_ =
         (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *)
         local_b0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,0);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                       *)local_210);
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_210._0_8_ = &eta;
    local_1b0._0_8_ = local_1e8;
    local_220 = (undefined1 *)0x2;
    local_210._8_8_ = &local_228;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_180._0_8_ = local_198;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = &local_240;
    local_200._0_8_ = local_180;
    local_200._8_8_ = local_260;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&qsi;
    FStack_1d8 = (FadCst<int>)local_210._0_8_;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_1c8._8_8_ = &zeta;
    local_1b0._8_8_ = &zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,1);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_200);
    local_1e0.constant_ = 1;
    local_1e0.defaultVal = 0;
    local_1b0._0_8_ = local_1e8;
    local_78.constant_ = -2;
    local_78.defaultVal = 0;
    local_220 = (undefined1 *)0xfffffffe;
    local_218 = (FadCst<int>)&eta;
    local_210._0_8_ = &local_228;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = &local_240;
    local_200._0_8_ = local_198;
    local_200._8_8_ = local_260;
    local_230 = (FadCst<int>)&zeta;
    local_210._8_8_ = &qsi;
    FStack_1d8 = (FadCst<int>)&qsi;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_1c8._8_8_ = &zeta;
    local_1b0._8_8_ = &zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,1);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_200);
    local_b0 = &eta;
    local_140._0_8_ = &local_a0;
    local_c8 = &local_e0;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = (undefined1 *)0xffffffff;
    local_f0 = local_1e8;
    local_e8 = &local_228;
    local_c0 = &local_d0;
    local_b8 = &local_f0;
    local_a8 = &local_c0;
    local_170 = (FadCst<int>)local_140;
    local_168 = (FadCst<int>)&local_b0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)0xffffffff;
    local_108 = (Fad<double> *)local_198;
    local_100 = &local_240;
    local_f8 = &local_110;
    local_180._0_8_ = &local_170;
    local_180._8_8_ = &local_100;
    local_1b0._8_4_ = -1;
    local_1b0._12_4_ = 0;
    local_1c8._8_4_ = -1;
    local_1c8._12_4_ = 0;
    local_88 = (FadCst<int>)local_1b0;
    local_80 = local_1c8;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_210._0_8_ = local_180;
    local_210._8_8_ = local_260;
    local_248 = &local_88;
    local_230 = (FadCst<int>)&qsi;
    local_218 = (FadCst<int>)&zeta;
    local_200._16_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_1c8._16_8_ = &zeta;
    local_1b0._16_8_ = &zeta;
    local_188 = (FadCst<int>)&zeta;
    local_140._8_8_ = &qsi;
    local_110 = (FadCst<int>)local_200;
    local_e0 = (FadCst<int>)&qsi;
    local_d8 = (FadCst<int>)&qsi;
    local_d0 = (FadCst<int>)&qsi;
    local_a0.fadexpr_.left_ =
         (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *)
         local_b0;
    local_a0.fadexpr_.right_ =
         (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *)
         local_b0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,1);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                       *)local_210);
    local_1e0.constant_ = 1;
    local_1e0.defaultVal = 0;
    local_210._0_8_ = &eta;
    local_1b0._0_8_ = local_1e8;
    local_220 = (undefined1 *)0x2;
    local_210._8_8_ = &local_228;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_180._0_8_ = local_198;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = &local_240;
    local_200._0_8_ = local_180;
    local_200._8_8_ = local_260;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&qsi;
    FStack_1d8 = (FadCst<int>)local_210._0_8_;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_1c8._8_8_ = &zeta;
    local_1b0._8_8_ = &zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,2);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_200);
    local_1e0.constant_ = 1;
    local_1e0.defaultVal = 0;
    local_1b0._0_8_ = local_1e8;
    local_220 = (undefined1 *)0x2;
    local_218 = (FadCst<int>)&eta;
    local_210._0_8_ = &local_228;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_180._0_8_ = local_198;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = &local_240;
    local_200._0_8_ = local_180;
    local_200._8_8_ = local_260;
    local_230 = (FadCst<int>)&zeta;
    local_210._8_8_ = &qsi;
    FStack_1d8 = (FadCst<int>)&qsi;
    local_1c8._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_210;
    local_1c8._8_8_ = &zeta;
    local_1b0._8_8_ = &zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,2);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_200);
    local_b0 = &eta;
    local_140._0_8_ = &local_a0;
    local_d0 = (FadCst<int>)&local_90;
    local_c8 = &local_e0;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = (undefined1 *)0xffffffff;
    local_f0 = local_1e8;
    local_e8 = &local_228;
    local_c0 = &local_d0;
    local_b8 = &local_f0;
    local_a8 = &local_c0;
    local_170 = (FadCst<int>)local_140;
    local_168 = (FadCst<int>)&local_b0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)0xffffffff;
    local_108 = (Fad<double> *)local_198;
    local_100 = &local_240;
    local_f8 = &local_110;
    local_180._0_8_ = &local_170;
    local_180._8_8_ = &local_100;
    local_1b0._8_4_ = -1;
    local_1b0._12_4_ = 0;
    local_1c8._8_4_ = -1;
    local_1c8._12_4_ = 0;
    local_88 = (FadCst<int>)local_1b0;
    local_80 = local_1c8;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_210._0_8_ = local_180;
    local_210._8_8_ = local_260;
    local_248 = &local_88;
    local_230 = (FadCst<int>)&qsi;
    local_218 = (FadCst<int>)&zeta;
    local_200._16_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_1c8._16_8_ = &zeta;
    local_1b0._16_8_ = &zeta;
    local_188 = (FadCst<int>)&zeta;
    local_140._8_8_ = &qsi;
    local_110 = (FadCst<int>)local_200;
    local_e0 = (FadCst<int>)&qsi;
    local_d8 = (FadCst<int>)&qsi;
    local_a0.fadexpr_.left_ =
         (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *)
         local_b0;
    local_a0.fadexpr_.right_ =
         (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *)
         local_b0;
    local_90 = (FadCst<int>)&qsi;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,2);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                       *)local_210);
    local_1e0.constant_ = 1;
    local_1e0.defaultVal = 0;
    local_210._0_8_ = &eta;
    local_1b0._0_8_ = local_1e8;
    local_220 = (undefined1 *)0x2;
    local_210._8_8_ = &local_228;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = &local_240;
    local_200._0_8_ = local_198;
    local_200._8_8_ = local_260;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&qsi;
    FStack_1d8 = (FadCst<int>)local_210._0_8_;
    local_1c8._0_8_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
          *)local_210;
    local_1c8._8_8_ = &zeta;
    local_1b0._8_8_ = &zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,3);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_200);
    local_1e0.constant_ = 2;
    local_1e0.defaultVal = 0;
    FStack_1d8 = (FadCst<int>)&eta;
    local_1c8._0_8_ = local_1e8;
    local_1b0._0_8_ = local_1c8;
    local_220 = (undefined1 *)0xffffffff;
    local_210._0_8_ = &local_228;
    local_198 = (undefined1  [8])local_1b0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = &local_240;
    local_200._0_8_ = local_198;
    local_200._8_8_ = local_260;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&qsi;
    local_210._8_8_ = &zeta;
    local_1c8._8_8_ = &qsi;
    local_1b0._8_8_ = &zeta;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_210;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,3);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_200);
    local_140._0_8_ = &local_a0;
    local_90 = (FadCst<int>)local_140;
    local_c8 = &local_e0;
    local_c0 = &local_d0;
    local_b8 = &local_f0;
    local_b0 = &eta;
    local_a8 = &local_c0;
    local_170 = (FadCst<int>)&local_90;
    local_168 = (FadCst<int>)&local_b0;
    local_108 = (Fad<double> *)local_198;
    local_100 = &local_240;
    local_f8 = &local_110;
    local_180._0_8_ = &local_170;
    local_180._8_8_ = &local_100;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40100000;
    FStack_250 = (FadCst<int>)0x0;
    local_210._0_8_ = local_180;
    local_210._8_8_ = local_260;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = (undefined1 *)0xffffffff;
    local_f0 = local_1e8;
    local_e8 = &local_228;
    local_238.constant_ = 1;
    local_238.defaultVal = 0;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)0xffffffff;
    local_1b0._8_4_ = -1;
    local_1b0._12_4_ = 0;
    local_1c8._8_4_ = -1;
    local_1c8._12_4_ = 0;
    local_88 = (FadCst<int>)local_1b0;
    local_80 = local_1c8;
    local_248 = &local_88;
    local_230 = (FadCst<int>)&qsi;
    local_218 = (FadCst<int>)&zeta;
    local_200._16_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_1c8._16_8_ = &zeta;
    local_1b0._16_8_ = &zeta;
    local_188 = (FadCst<int>)&zeta;
    local_140._8_8_ = &qsi;
    local_110 = (FadCst<int>)local_200;
    local_e0 = (FadCst<int>)&qsi;
    local_d8 = (FadCst<int>)&qsi;
    local_d0 = (FadCst<int>)&qsi;
    local_a0.fadexpr_.left_ =
         (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *)
         local_b0;
    local_a0.fadexpr_.right_ =
         (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *)
         local_b0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,3);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                       *)local_210);
    local_260._0_8_ = local_260._0_8_ & 0xffffffff00000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,4);
    Fad<double>::operator=<int,_nullptr>(pFVar1,(int *)local_260);
    local_260._0_8_ = local_260._0_8_ & 0xffffffff00000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,4);
    Fad<double>::operator=<int,_nullptr>(pFVar1,(int *)local_260);
    local_1e0.constant_ = 4;
    local_1e0.defaultVal = 0;
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)local_1e8;
    FStack_1d8 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,4);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                       *)local_260);
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&eta;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_228 = (FadCst<int>)&local_240;
    local_220 = local_1e8;
    local_198 = (undefined1  [8])&local_228;
    local_240 = (FadCst<int>)&qsi;
    local_238 = (FadCst<int>)local_200;
    local_200._0_8_ = local_260;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,5);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_198);
    local_210._0_8_ = local_1b0;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = (undefined1 *)0xffffffff;
    local_1c8._0_8_ = local_1e8;
    local_1c8._8_8_ = &local_228;
    local_198 = (undefined1  [8])local_210;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40000000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = &local_240;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&zeta;
    local_200._0_8_ = (Fad<double> *)local_198;
    local_200._8_8_ = local_260;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_1b0._0_8_ = &qsi;
    local_1b0._8_8_ = &qsi;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,5);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_200);
    local_1e0 = local_78;
    local_210._0_8_ = &eta;
    local_210._8_8_ = local_180;
    local_220 = (undefined1 *)0xffffffff;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_170 = (FadCst<int>)&local_228;
    local_168 = (FadCst<int>)&local_240;
    local_1c8._0_8_ = local_210;
    local_1c8._8_8_ = &local_170;
    local_1b0._0_8_ = local_1e8;
    local_1b0._8_8_ = local_1c8;
    local_200._8_4_ = 2;
    local_200._12_4_ = 0;
    local_198 = (undefined1  [8])local_1b0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40000000;
    FStack_250 = (FadCst<int>)0x0;
    local_260._0_8_ = (Fad<double> *)local_198;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&zeta;
    local_200._16_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)local_210._0_8_;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_200;
    local_180._0_8_ = &qsi;
    local_180._8_8_ = &qsi;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,5);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                       *)local_260);
    local_1b0._0_8_ = &eta;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = (undefined1 *)0xffffffff;
    local_1c8._0_8_ = local_1e8;
    local_1c8._8_8_ = &local_228;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40000000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = &local_240;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&zeta;
    local_200._0_8_ = (Fad<double> *)local_198;
    local_200._8_8_ = local_260;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_1b0._8_8_ = local_1b0._0_8_;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,6);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_200);
    local_260._8_4_ = 1;
    local_260._12_4_ = 0;
    local_240 = (FadCst<int>)&eta;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_228 = (FadCst<int>)&local_240;
    local_220 = local_1e8;
    FStack_250 = (FadCst<int>)&qsi;
    local_238 = (FadCst<int>)local_200;
    local_200._0_8_ = local_260;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,6);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                       *)&local_228);
    local_210._0_8_ = &eta;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_180._0_8_ = &local_240;
    local_1e0.constant_ = 0;
    local_1e0.defaultVal = 0x40000000;
    FStack_1d8 = (FadCst<int>)0x0;
    local_1d0 = local_180;
    local_1c8._0_8_ = local_210;
    local_1c8._8_8_ = local_1e8;
    local_260._8_4_ = 0;
    local_260._12_4_ = -0x40200000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (FadCst<int> *)local_1c8;
    local_1b0._0_8_ = &qsi;
    local_220 = (undefined1 *)0xffffffff;
    local_218 = (FadCst<int>)local_1b0;
    local_230 = (FadCst<int>)&zeta;
    local_210._8_8_ = local_210._0_8_;
    local_200._16_8_ = &zeta;
    local_1b0._8_8_ = local_260;
    local_198 = (undefined1  [8])&local_228;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)&zeta;
    local_180._8_8_ =
         (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
          *)local_200;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,6);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>_>_>
                       *)local_198);
    local_260._8_4_ = 1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&eta;
    local_240 = (FadCst<int>)&qsi;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_228 = (FadCst<int>)&local_240;
    local_220 = local_1e8;
    local_238 = (FadCst<int>)local_200;
    local_200._0_8_ = local_260;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,7);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                       *)&local_228);
    local_1b0._0_8_ = &qsi;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = (undefined1 *)0xffffffff;
    local_1c8._0_8_ = local_1e8;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40000000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = &local_240;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&zeta;
    local_200._0_8_ = (Fad<double> *)local_198;
    local_200._8_8_ = local_260;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_1c8._8_8_ = &local_228;
    local_1b0._8_8_ = local_1b0._0_8_;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,7);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_200);
    local_210._0_8_ = &qsi;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_200._8_4_ = -1;
    local_200._12_4_ = 0;
    local_180._0_8_ = &local_240;
    local_1e0.constant_ = 0;
    local_1e0.defaultVal = 0x40000000;
    FStack_1d8 = (FadCst<int>)0x0;
    local_1d0 = local_180;
    local_1c8._0_8_ = local_210;
    local_1c8._8_8_ = local_1e8;
    local_260._8_4_ = 0;
    local_260._12_4_ = -0x40200000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (FadCst<int> *)local_1c8;
    local_1b0._0_8_ = &eta;
    local_220 = (undefined1 *)0xffffffff;
    local_218 = (FadCst<int>)local_1b0;
    local_230 = (FadCst<int>)&zeta;
    local_210._8_8_ = local_210._0_8_;
    local_200._16_8_ = &zeta;
    local_1b0._8_8_ = local_260;
    local_198 = (undefined1  [8])&local_228;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)&zeta;
    local_180._8_8_ =
         (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
          *)local_200;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,7);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>_>_>
                       *)local_198);
    local_1b0._0_8_ = &eta;
    local_210._0_8_ = local_1b0;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = (undefined1 *)0xffffffff;
    local_1c8._0_8_ = local_1e8;
    local_198 = (undefined1  [8])local_210;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40000000;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = &local_240;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&zeta;
    local_200._0_8_ = (Fad<double> *)local_198;
    local_200._8_8_ = local_260;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_1c8._8_8_ = &local_228;
    local_1b0._8_8_ = local_1b0._0_8_;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,8);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_200);
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&qsi;
    local_240 = (FadCst<int>)&eta;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_228 = (FadCst<int>)&local_240;
    local_220 = local_1e8;
    local_238 = (FadCst<int>)local_200;
    local_200._0_8_ = local_260;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_198 = (undefined1  [8])&local_228;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,8);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_198);
    local_1e0 = local_78;
    local_210._8_8_ = &qsi;
    local_180._0_8_ = &eta;
    local_210._0_8_ = local_180;
    local_220 = (undefined1 *)0xffffffff;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_168 = (FadCst<int>)&local_240;
    local_1c8._0_8_ = local_210;
    local_1c8._8_8_ = &local_170;
    local_1b0._0_8_ = local_1e8;
    local_1b0._8_8_ = local_1c8;
    local_200._8_4_ = 2;
    local_200._12_4_ = 0;
    local_198 = (undefined1  [8])local_1b0;
    local_260._8_4_ = 0;
    local_260._12_4_ = 0x40000000;
    FStack_250 = (FadCst<int>)0x0;
    local_260._0_8_ = (Fad<double> *)local_198;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&zeta;
    local_200._16_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)local_210._8_8_;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_200;
    local_180._8_8_ = local_180._0_8_;
    local_170 = (FadCst<int>)&local_228;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,8);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                       *)local_260);
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&eta;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_228 = (FadCst<int>)&local_240;
    local_220 = local_1e8;
    local_240 = (FadCst<int>)&zeta;
    local_238 = (FadCst<int>)local_200;
    local_200._0_8_ = (Fad<double> *)local_260;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_198 = (undefined1  [8])&local_228;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,9);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_198);
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&qsi;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_228 = (FadCst<int>)&local_240;
    local_220 = local_1e8;
    local_240 = (FadCst<int>)&zeta;
    local_238 = (FadCst<int>)local_200;
    local_200._0_8_ = (Fad<double> *)local_260;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_198 = (undefined1  [8])&local_228;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,9);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                       *)local_198);
    local_260._8_4_ = 1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&qsi;
    local_220 = (undefined1 *)0xffffffff;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_210._8_8_ = local_180;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    FStack_1d8 = (FadCst<int>)local_210;
    local_1c8._0_8_ = &eta;
    local_1c8._8_8_ = local_1e8;
    local_1b0._8_8_ = local_1c8;
    local_200._8_4_ = 2;
    local_200._12_4_ = 0;
    local_198 = (undefined1  [8])local_1b0;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&zeta;
    local_210._0_8_ = FStack_250;
    local_200._16_8_ = &zeta;
    local_1b0._0_8_ = (Fad<double> *)local_260;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_200;
    local_180._0_8_ = &local_228;
    local_180._8_8_ = &local_240;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,9);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                       *)local_198);
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&eta;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = local_1e8;
    local_240 = (FadCst<int>)&zeta;
    local_238 = (FadCst<int>)local_200;
    local_228 = (FadCst<int>)&local_240;
    local_200._0_8_ = (Fad<double> *)local_260;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,10);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                       *)&local_228);
    local_260._8_4_ = 1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&qsi;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = local_1e8;
    local_240 = (FadCst<int>)local_200;
    local_238 = (FadCst<int>)&zeta;
    local_228 = (FadCst<int>)&local_240;
    local_200._0_8_ = (Fad<double> *)local_260;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,10);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                       *)&local_228);
    local_260._8_4_ = 1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&qsi;
    local_220 = (undefined1 *)0xffffffff;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_180._8_8_ = &local_240;
    local_210._8_8_ = local_180;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    FStack_1d8 = (FadCst<int>)local_210;
    local_1c8._0_8_ = &eta;
    local_1c8._8_8_ = local_1e8;
    local_1b0._8_8_ = local_1c8;
    local_200._8_4_ = 2;
    local_200._12_4_ = 0;
    local_198 = (undefined1  [8])local_1b0;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&zeta;
    local_210._0_8_ = FStack_250;
    local_200._16_8_ = &zeta;
    local_1b0._0_8_ = (Fad<double> *)local_260;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_200;
    local_180._0_8_ = &local_228;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,10);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                       *)local_198);
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&eta;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_228 = (FadCst<int>)&local_240;
    local_220 = local_1e8;
    local_240 = (FadCst<int>)&zeta;
    local_238 = (FadCst<int>)local_200;
    local_200._0_8_ = (Fad<double> *)local_260;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,0xb);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                       *)&local_228);
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&qsi;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_228 = (FadCst<int>)&local_240;
    local_220 = local_1e8;
    local_240 = (FadCst<int>)&zeta;
    local_238 = (FadCst<int>)local_200;
    local_200._0_8_ = (Fad<double> *)local_260;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,0xb);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                       *)&local_228);
    local_260._8_4_ = 1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&eta;
    local_210._8_8_ = &qsi;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = (undefined1 *)0xffffffff;
    local_180._0_8_ = local_1e8;
    local_1c8._0_8_ = local_210;
    local_1c8._8_8_ = local_180;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_238.constant_ = 2;
    local_238.defaultVal = 0;
    local_200._8_8_ = &local_240;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&zeta;
    local_210._0_8_ = FStack_250;
    local_200._0_8_ = (Fad<double> *)local_198;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_1b0._0_8_ = (Fad<double> *)local_260;
    local_1b0._8_8_ = local_210._8_8_;
    local_180._8_8_ = &local_228;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,0xb);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                       *)local_200);
    local_260._8_4_ = 1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&eta;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_228 = (FadCst<int>)&local_240;
    local_220 = local_1e8;
    local_240 = (FadCst<int>)local_200;
    local_238 = (FadCst<int>)&zeta;
    local_200._0_8_ = (Fad<double> *)local_260;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,0xc);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                       *)&local_228);
    local_260._8_4_ = -1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&qsi;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_228 = (FadCst<int>)&local_240;
    local_220 = local_1e8;
    local_240 = (FadCst<int>)&zeta;
    local_238 = (FadCst<int>)local_200;
    local_200._0_8_ = (Fad<double> *)local_260;
    local_200._8_8_ = &zeta;
    FStack_1d8 = (FadCst<int>)&zeta;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,0xc);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                       *)&local_228);
    local_260._8_4_ = 1;
    local_260._12_4_ = 0;
    FStack_250 = (FadCst<int>)&eta;
    local_210._8_8_ = &qsi;
    local_1e0.constant_ = -1;
    local_1e0.defaultVal = 0;
    local_220 = (undefined1 *)0xffffffff;
    local_180._0_8_ = local_1e8;
    local_1c8._0_8_ = local_210;
    local_1c8._8_8_ = local_180;
    local_198 = (undefined1  [8])local_1b0;
    local_190 = (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_1c8;
    local_238.constant_ = 2;
    local_238.defaultVal = 0;
    local_200._8_8_ = &local_240;
    local_230 = (FadCst<int>)&zeta;
    local_218 = (FadCst<int>)&zeta;
    local_210._0_8_ = FStack_250;
    local_200._0_8_ = (Fad<double> *)local_198;
    FStack_1d8 = (FadCst<int>)&zeta;
    local_1b0._0_8_ = (Fad<double> *)local_260;
    local_1b0._8_8_ = local_210._8_8_;
    local_180._8_8_ = &local_228;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,0xc);
    Fad<double>::operator=
              (pFVar1,(FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                       *)local_200);
  }
  else {
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,0,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,1,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,2,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,3,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x3ff0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,4,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,5,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,6,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,7,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,8,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,9,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,10,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,0xb,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,0xc,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbfd0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,0);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,1);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,1);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbfd0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,1);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,2);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,2);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbfd0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,2);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,3);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,3);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbfd0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,3);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,4);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,4);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x4008000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,4);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,5);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x3fe0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,5);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x3fe0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,5);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbfe0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,6);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,6);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x3fe0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,6);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,7);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbfe0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,7);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x3fe0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,7);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x3fe0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,8);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x0;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,8);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x3fe0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,8);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbff0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,9);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbff0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,9);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbff0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,9);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x3ff0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,10);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbff0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,10);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbff0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,10);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x3ff0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,0xb);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0x3ff0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,0xb);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbff0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,0xb);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_4_ = 0xffffffff;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,0xc);
    Fad<double>::operator=<int,_nullptr>(pFVar1,(int *)local_260);
    local_260._0_8_ = (Fad<double> *)0x3ff0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,0xc);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
    local_260._0_8_ = (Fad<double> *)0xbff0000000000000;
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,0xc);
    Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_260);
  }
  Fad<double>::~Fad(&check);
  Fad<double>::~Fad(&zeta);
  Fad<double>::~Fad(&eta);
  Fad<double>::~Fad(&qsi);
  return;
}

Assistant:

void TPZQuadraticPyramid::TShape(const TPZVec<T> &par,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = par[0], eta = par[1], zeta = par[2];
    T check = zeta-1.;
    if(fabs(check) < 1.E-6)
    {
        phi(0,0)  = 0.;
        phi(1,0)  = 0.;
        phi(2,0)  = 0.;
        phi(3,0)  = 0.;
        phi(4,0)  = 1.;
        phi(5,0)  = 0.;
        phi(6,0)  = 0.;
        phi(7,0)  = 0.;
        phi(8,0)  = 0.;
        phi(9,0)  = 0.;
        phi(10,0) = 0.;
        phi(11,0) = 0.;
        phi(12,0) = 0.;
        
        dphi(0,0) = 0.;
        dphi(1,0) = 0.;
        dphi(2,0) = -0.25;
        
        dphi(0,1) = 0.;
        dphi(1,1) = 0.;
        dphi(2,1) = -0.25;
        
        dphi(0,2) = 0.;
        dphi(1,2) = 0.;
        dphi(2,2) = -0.25;
        
        dphi(0,3) = 0.;
        dphi(1,3) = 0.;
        dphi(2,3) = -0.25;
        
        dphi(0,4) = 0.;
        dphi(1,4) = 0.;
        dphi(2,4) = 3.;
        
        dphi(0,5) = 0.;
        dphi(1,5) = 0.5;
        dphi(2,5) = 0.5;
        
        dphi(0,6) = -0.5;
        dphi(1,6) = 0.;
        dphi(2,6) = 0.5;
        
        dphi(0,7) = 0.;
        dphi(1,7) = -0.5;
        dphi(2,7) = 0.5;
        
        dphi(0,8) = 0.5;
        dphi(1,8) = 0.;
        dphi(2,8) = 0.5;
        
        dphi(0,9) = -1.;
        dphi(1,9) = -1.;
        dphi(2,9) = -1.;
        
        dphi(0,10) = 1.;
        dphi(1,10) = -1.;
        dphi(2,10) = -1.;
        
        dphi(0,11) = 1.;
        dphi(1,11) = 1.;
        dphi(2,11) = -1.;
        
        dphi(0,12) = -1;
        dphi(1,12) = 1.;
        dphi(2,12) = -1.;
        
        return;
    }

    phi(0,0) = ((1 + eta + qsi)*(-1 + eta + zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    phi(1,0) = -((1 + eta - qsi)*(1 + qsi - zeta)*(-1 + eta + zeta))/(4.*(-1 + zeta));
    phi(2,0) = -((-1 + eta + qsi)*(1 + eta - zeta)*(1 + qsi - zeta))/(4.*(-1 + zeta));
    phi(3,0) = ((-1 + eta - qsi)*(1 + eta - zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    phi(4,0) = zeta*(-1 + 2*zeta);
    phi(5,0) = ((-1 + eta + zeta)*(-1 - qsi + zeta)*(-1 + qsi + zeta))/(2.*(-1 + zeta));
    phi(6,0) = ((-1 - eta + zeta)*(-1 + eta + zeta)*(-1 - qsi + zeta))/(2.*(-1 + zeta));
    phi(7,0) = ((qsi*qsi - (-1 + zeta)*(-1 + zeta))*(1 + eta - zeta))/(2.*(-1 + zeta));
    phi(8,0) = ((-(eta*eta) + (-1 + zeta)*(-1 + zeta))*(-1 + qsi + zeta))/(2.*(-1 + zeta));
    phi(9,0) = -((zeta*(-1 + eta + zeta)*(-1 + qsi + zeta))/(-1 + zeta));
    phi(10,0) = -((zeta*(-1 + eta + zeta)*(-1 - qsi + zeta))/(-1 + zeta));
    phi(11,0) = ((1 + eta - zeta)*(1 + qsi - zeta)*zeta)/(1 - zeta);
    phi(12,0) = -((zeta*(-1 - eta + zeta)*(-1 + qsi + zeta))/(-1 + zeta));


    dphi(0,0) = ((-1 + eta + zeta)*(eta + 2*qsi + zeta))/(4.*(-1 + zeta));
    dphi(1,0) = ((-1 + qsi + zeta)*(2*eta + qsi + zeta))/(4.*(-1 + zeta));
    dphi(2,0) = -(eta*eta*qsi + eta*(qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) - (1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,1) = -((-1 + eta + zeta)*(eta - 2*qsi + zeta))/(4.*(-1 + zeta));
    dphi(1,1) = ((1 + qsi - zeta)*(-2*eta + qsi - zeta))/(4.*(-1 + zeta));
    dphi(2,1) = (eta*eta*qsi + eta*(qsi - qsi*qsi + (-1 + zeta)*(-1 + zeta)) - (-1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,2) = -((1 + eta - zeta)*(eta + 2*qsi - zeta))/(4.*(-1 + zeta));
    dphi(1,2) = -((1 + qsi - zeta)*(2*eta + qsi - zeta))/(4.*(-1 + zeta));
    dphi(2,2) = (eta*eta*qsi + eta*(-qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) - (-1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,3) = ((1 + eta - zeta)*(eta - 2*qsi - zeta))/(4.*(-1 + zeta));
    dphi(1,3) = ((2*eta - qsi - zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    dphi(2,3) = (-(eta*eta*qsi) + eta*(qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) + (1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,4) = 0;
    dphi(1,4) = 0;
    dphi(2,4) = -1 + 4*zeta;

    dphi(0,5) = -((qsi*(-1 + eta + zeta))/(-1 + zeta));
    dphi(1,5) = (-(qsi*qsi) + (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(2,5) = (-2 + eta + (eta*(qsi*qsi))/((-1 + zeta)*(-1 + zeta)) + 2*zeta)/2.;

    dphi(0,6) = (eta*eta - (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(1,6) = (eta*(1 + qsi - zeta))/(-1 + zeta);
    dphi(2,6) = -1 + qsi*(-0.5 - (eta*eta)/(2.*((-1 + zeta)*(-1 + zeta)))) + zeta;

    dphi(0,7) = (qsi*(1 + eta - zeta))/(-1 + zeta);
    dphi(1,7) = (qsi*qsi - (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(2,7) = -1 + eta*(-0.5 - (qsi*qsi)/(2.*((-1 + zeta)*(-1 + zeta)))) + zeta;

    dphi(0,8) = (-(eta*eta) + (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(1,8) = -((eta*(-1 + qsi + zeta))/(-1 + zeta));
    dphi(2,8) = (-2 + qsi + (eta*eta*qsi)/((-1 + zeta)*(-1 + zeta)) + 2*zeta)/2.;

    dphi(0,9) = -((zeta*(-1 + eta + zeta))/(-1 + zeta));
    dphi(1,9) = -((zeta*(-1 + qsi + zeta))/(-1 + zeta));
    dphi(2,9) = 1 - qsi + eta*(-1 + qsi/((-1 + zeta)*(-1 + zeta))) - 2*zeta;

    dphi(0,10) = (zeta*(-1 + eta + zeta))/(-1 + zeta);
    dphi(1,10) = ((1 + qsi - zeta)*zeta)/(-1 + zeta);
    dphi(2,10) = 1 + qsi + eta*(-1 - qsi/((-1 + zeta)*(-1 + zeta))) - 2*zeta;

    dphi(0,11) = (zeta*(-1 - eta + zeta))/(-1 + zeta);
    dphi(1,11) = (zeta*(-1 - qsi + zeta))/(-1 + zeta);
    dphi(2,11) = 1 + eta + qsi + (eta*qsi)/((-1 + zeta)*(-1 + zeta)) - 2*zeta;

    dphi(0,12) = ((1 + eta - zeta)*zeta)/(-1 + zeta);
    dphi(1,12) = (zeta*(-1 + qsi + zeta))/(-1 + zeta);
    dphi(2,12) = 1 + eta - qsi - (eta*qsi)/((-1 + zeta)*(-1 + zeta)) - 2*zeta;
    
}